

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

base_learner * bfgs_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  options_i *this;
  bfgs *__s;
  typed_option<int> *op;
  typed_option<float> *op_00;
  typed_option<unsigned_long> *ptVar5;
  size_t sVar6;
  learner<bfgs,_example> *plVar7;
  vw_exception *this_00;
  uint32_t *puVar8;
  long lVar9;
  code *predict;
  char *pcVar10;
  code *learn;
  long lVar11;
  vw_ostream *pvVar12;
  bool bfgs_option;
  bool conjugate_gradient;
  option_group_definition bfgs_inner_options;
  option_group_definition bfgs_outer_options;
  stringstream __msg;
  bool local_36a;
  bool local_369;
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  free_ptr<bfgs> local_348;
  bool *local_338;
  option_group_definition local_330;
  options_i *local_2f8;
  option_group_definition local_2f0;
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [48];
  string local_1a8 [64];
  bool local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  string local_50;
  
  __s = calloc_or_throw<bfgs>(1);
  memset(__s,0,0x118);
  local_348._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<bfgs>;
  local_369 = false;
  local_36a = false;
  local_348._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>._M_head_impl
       = __s;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,"LBFGS and Conjugate Gradient options","");
  local_2f0.m_name._M_dataplus._M_p = (pointer)&local_2f0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2f0,local_298,local_298 + local_290);
  local_2f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"conjugate_gradient","");
  local_2f8 = options;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1d8,&local_1f8,&local_369);
  local_168 = true;
  paVar1 = &local_330.m_name.field_2;
  local_330.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,"use conjugate gradient based optimization","");
  std::__cxx11::string::_M_assign(local_1a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_2f0,(typed_option<bool> *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_330.m_name._M_dataplus._M_p);
  }
  local_1d8._0_8_ = &PTR__typed_option_002dc108;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"LBFGS and Conjugate Gradient options","");
  local_330.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_330,local_2b8,local_2b8 + local_2b0);
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"bfgs","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1d8,&local_218,&local_36a);
  local_168 = true;
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"use conjugate gradient based optimization","");
  std::__cxx11::string::_M_assign(local_1a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_330,(typed_option<bool> *)local_1d8);
  if (local_368[0] != local_358) {
    operator_delete(local_368[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_002dc108;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"hessian_on","");
  local_338 = &all->hessian_on;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_1d8,&local_238,local_338)
  ;
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"use second derivative in line search","");
  std::__cxx11::string::_M_assign(local_1a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_330,(typed_option<bool> *)local_1d8);
  if (local_368[0] != local_358) {
    operator_delete(local_368[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_002dc108;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"mem","");
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_1d8,&local_258,&__s->m);
  op = VW::config::typed_option<int>::default_value((typed_option<int> *)local_1d8,0xf);
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"memory in bfgs","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(&local_330,op);
  if (local_368[0] != local_358) {
    operator_delete(local_368[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_002dc6b0;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"termination","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1d8,&local_278,&__s->rel_threshold);
  op_00 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_1d8,0.001);
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"Termination threshold","");
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_330,op_00);
  if (local_368[0] != local_358) {
    operator_delete(local_368[0]);
  }
  this = local_2f8;
  local_1d8._0_8_ = &PTR__typed_option_002dc0d0;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  (**this->_vptr_options_i)(this,&local_2f0);
  if ((local_369 == false) && ((**this->_vptr_options_i)(this,&local_330), local_36a == false)) {
    plVar7 = (learner<bfgs,_example> *)0x0;
  }
  else {
    __s->all = all;
    __s->wolfe1_bound = 0.01;
    __s->first_hessian_on = true;
    __s->backstep_on = false;
    __s->first_pass = true;
    __s->gradient_pass = true;
    __s->preconditioner_pass = true;
    __s->final_pass = all->numpasses;
    __s->no_win_counter = 0;
    if (all->holdout_set_off == false) {
      all->sd->holdout_best_loss = 3.4028234663852886e+38;
      local_1d8._0_8_ = local_1d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"early_terminate","");
      ptVar5 = VW::config::options_i::get_typed_option<unsigned_long>(this,(string *)local_1d8);
      psVar2 = (ptVar5->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (psVar2 == (size_t *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = *psVar2;
      }
      __s->early_stop_thres = sVar6;
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_);
      }
    }
    if (__s->m == 0) {
      *local_338 = true;
    }
    if (all->quiet == false) {
      pcVar10 = "enabling conjugate gradient optimization via BFGS ";
      if (0 < __s->m) {
        pcVar10 = "enabling BFGS based optimization ";
      }
      lVar11 = 0x21;
      lVar9 = 0x32;
      if (0 < __s->m) {
        lVar9 = 0x21;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&(__s->all->trace_message).super_ostream,pcVar10,lVar9);
      pvVar12 = &__s->all->trace_message;
      pcVar10 = "**without** curvature calculation";
      if (*local_338 != false) {
        pcVar10 = "with curvature calculation";
        lVar11 = 0x1a;
      }
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar12->super_ostream,pcVar10,lVar11);
      std::ios::widen((char)(pvVar12->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar12);
      std::ostream::put((char)pvVar12);
      std::ostream::flush();
    }
    if ((all->numpasses < 2) && (all->training == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1d8 + 0x10),"you must make at least 2 passes to use BFGS",0x2b);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                 ,0x47d,&local_50);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->bfgs = true;
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
    }
    else {
      (all->weights).dense_weights._stride_shift = 2;
    }
    learn = learn<false>;
    if (all->audit != false) {
      learn = learn<true>;
    }
    predict = predict<false>;
    if (((all->audit | all->hash_inv) & 1U) != 0) {
      predict = predict<true>;
    }
    puVar8 = &(all->weights).dense_weights._stride_shift;
    if (((all->weights).sparse & 1U) != 0) {
      puVar8 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar7 = LEARNER::init_learner<bfgs,example,LEARNER::learner<char,char>>
                       (&local_348,learn,predict,(ulong)(uint)(1 << ((byte)*puVar8 & 0x1f)));
    *(code **)(plVar7 + 0x80) = save_load;
    uVar3 = *(undefined8 *)(plVar7 + 0x18);
    uVar4 = *(undefined8 *)(plVar7 + 0x20);
    *(undefined8 *)(plVar7 + 0x70) = uVar3;
    *(undefined8 *)(plVar7 + 0x78) = uVar4;
    *(undefined8 *)plVar7 = uVar3;
    *(undefined8 *)(plVar7 + 8) = uVar4;
    *(code **)(plVar7 + 0x10) = init_driver;
    *(undefined8 *)(plVar7 + 0x88) = uVar3;
    *(undefined8 *)(plVar7 + 0x90) = uVar4;
    *(code **)(plVar7 + 0x98) = end_pass;
    *(undefined8 *)(plVar7 + 0xb8) = uVar3;
    *(undefined8 *)(plVar7 + 0xc0) = uVar4;
    *(code **)(plVar7 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_330.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    operator_delete(local_330.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2f0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_name._M_dataplus._M_p != &local_2f0.m_name.field_2) {
    operator_delete(local_2f0.m_name._M_dataplus._M_p);
  }
  if (local_348._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
      _M_head_impl != (bfgs *)0x0) {
    (*(code *)local_348._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_348._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* bfgs_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<bfgs>();
  bool conjugate_gradient = false;
  bool bfgs_option = false;
  option_group_definition bfgs_outer_options("LBFGS and Conjugate Gradient options");
  bfgs_outer_options.add(
      make_option("conjugate_gradient", conjugate_gradient).keep().help("use conjugate gradient based optimization"));

  option_group_definition bfgs_inner_options("LBFGS and Conjugate Gradient options");
  bfgs_inner_options.add(make_option("bfgs", bfgs_option).keep().help("use conjugate gradient based optimization"));
  bfgs_inner_options.add(make_option("hessian_on", all.hessian_on).help("use second derivative in line search"));
  bfgs_inner_options.add(make_option("mem", b->m).default_value(15).help("memory in bfgs"));
  bfgs_inner_options.add(
      make_option("termination", b->rel_threshold).default_value(0.001f).help("Termination threshold"));

  options.add_and_parse(bfgs_outer_options);
  if (!conjugate_gradient)
  {
    options.add_and_parse(bfgs_inner_options);
    if (!bfgs_option)
    {
      return nullptr;
    }
  }

  b->all = &all;
  b->wolfe1_bound = 0.01;
  b->first_hessian_on = true;
  b->first_pass = true;
  b->gradient_pass = true;
  b->preconditioner_pass = true;
  b->backstep_on = false;
  b->final_pass = all.numpasses;
  b->no_win_counter = 0;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (b->m == 0)
    all.hessian_on = true;

  if (!all.quiet)
  {
    if (b->m > 0)
      b->all->trace_message << "enabling BFGS based optimization ";
    else
      b->all->trace_message << "enabling conjugate gradient optimization via BFGS ";
    if (all.hessian_on)
      b->all->trace_message << "with curvature calculation" << endl;
    else
      b->all->trace_message << "**without** curvature calculation" << endl;
  }

  if (all.numpasses < 2 && all.training)
    THROW("you must make at least 2 passes to use BFGS");

  all.bfgs = true;
  all.weights.stride_shift(2);

  void (*learn_ptr)(bfgs&, base_learner&, example&) = nullptr;
  if (all.audit)
        learn_ptr = learn<true>;
  else
        learn_ptr = learn<false>;

    learner<bfgs, example>* l;
  if (all.audit || all.hash_inv)
        l = &init_learner(b, learn_ptr, predict<true>, all.weights.stride());
  else
        l = &init_learner(b, learn_ptr, predict<false>, all.weights.stride());

  l->set_save_load(save_load);
  l->set_init_driver(init_driver);
  l->set_end_pass(end_pass);
  l->set_finish(finish);

  return make_base(*l);
}